

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLinePath::InsertSubLine
          (ChLinePath *this,size_t n,shared_ptr<chrono::geometry::ChLine> *mline,double duration)

{
  iterator iVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  double local_30;
  double local_28;
  
  local_28 = duration;
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::insert(&this->lines,
           (this->lines).
           super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
           ._M_impl.super__Vector_impl_data._M_start + n,mline);
  local_30 = 0.0;
  iVar1._M_current =
       (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->durations,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = 0.0;
    (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  local_30 = 0.0;
  iVar1._M_current =
       (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->end_times,iVar1,&local_30);
  }
  else {
    *iVar1._M_current = 0.0;
    (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  pdVar2 = (this->durations).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2[n] = local_28;
  pdVar3 = (this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (n == 0) {
    dVar6 = 0.0;
  }
  else {
    dVar6 = pdVar3[n - 1];
  }
  uVar4 = (long)(this->end_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3 >> 3;
  lVar5 = uVar4 - n;
  if (n <= uVar4 && lVar5 != 0) {
    do {
      dVar6 = dVar6 + pdVar2[n];
      lVar5 = lVar5 + -1;
      pdVar3[n] = dVar6;
    } while (lVar5 != 0);
  }
  return;
}

Assistant:

void ChLinePath::InsertSubLine(size_t n, std::shared_ptr<ChLine> mline, double duration) {
    lines.insert(lines.begin() + n, mline);
    durations.push_back(0);
    end_times.push_back(0);
    // force recompute following end times:
    SetSubLineDurationN(n, duration);
}